

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subgraph.cpp
# Opt level: O1

void __thiscall Gecko::Subgraph::Subgraph(Subgraph *this,Graph *g,uint n)

{
  ulong uVar1;
  Subnode *pSVar2;
  out_of_range *this_00;
  ulong uVar3;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  this->g = g;
  this->n = n;
  this->f = g->functional;
  (this->min).super_WeightedValue = (WeightedValue)0x0;
  if (n < 0x11) {
    uVar1 = (ulong)(n << ((byte)n & 0x1f)) * 0xc;
    pSVar2 = (Subnode *)operator_new__(uVar1);
    if (n != 0) {
      uVar3 = 0;
      do {
        *(undefined8 *)((long)&(pSVar2->cost).super_WeightedValue.value + uVar3) = 0;
        uVar3 = uVar3 + 0xc;
      } while (uVar1 != uVar3);
    }
    this->cache = pSVar2;
    return;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"optimization window too large","");
  std::out_of_range::out_of_range(this_00,(string *)local_40);
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

Subgraph::Subgraph(Graph* g, uint n) : g(g), n(n), f(g->functional)
{
  if (n > GECKO_WINDOW_MAX)
    throw std::out_of_range("optimization window too large");
  cache = new Subnode[n << n];
}